

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

void __thiscall
EventDataType::serialize<cereal::PortableBinaryInputArchive>
          (EventDataType *this,PortableBinaryInputArchive *archive)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *unaff_retaddr;
  
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            (unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(name, origin);
    }